

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O1

type jsoncons::jsonpointer::
     get<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::__cxx11::string>
               (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *root,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *location_str,
               bool create_if_missing,error_code *ec)

{
  basic_json_pointer<char> jsonptr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  string_view_type local_28;
  
  local_28._M_str = (location_str->_M_dataplus)._M_p;
  local_28._M_len = location_str->_M_string_length;
  basic_json_pointer<char>::parse((basic_json_pointer<char> *)&local_40,&local_28,ec);
  if (ec->_M_value == 0) {
    root = get<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                     (root,(basic_json_pointer<char> *)&local_40,create_if_missing,ec);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_40);
  return root;
}

Assistant:

typename std::enable_if<std::is_convertible<StringSource,jsoncons::basic_string_view<typename Json::char_type>>::value,Json&>::type
    get(Json& root, 
        const StringSource& location_str, 
        bool create_if_missing,
        std::error_code& ec)
    {
        auto jsonptr = basic_json_pointer<typename Json::char_type>::parse(location_str, ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            return root;
        }
        return get(root, jsonptr, create_if_missing, ec);
    }